

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O2

bool helics::isTrueString(string_view str)

{
  const_iterator cVar1;
  char *in_RSI;
  long in_RDI;
  key_type local_10;
  
  if (in_RDI == 1) {
    if (*in_RSI == '0') {
      return false;
    }
    if (*in_RSI == '1') {
      return true;
    }
  }
  cVar1 = std::
          _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          ::find((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::_Identity<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                  *)falseString,&local_10);
  return cVar1._M_node == (_Base_ptr)(falseString + 8);
}

Assistant:

bool isTrueString(const std::string_view str)
{
    if (str.size() == 1 && str[0] == '1') {
        return true;
    }
    if (str.size() == 1 && str[0] == '0') {
        return false;
    }
    return (falseString.find(str) == falseString.end());
}